

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Span<QCache<QtFontFallbacksCacheKey,_QList<QString>_>::Node>::moveFromSpan
          (Span<QCache<QtFontFallbacksCacheKey,_QList<QString>_>::Node> *this,
          Span<QCache<QtFontFallbacksCacheKey,_QList<QString>_>::Node> *fromSpan,size_t fromIndex,
          size_t to)

{
  Entry *pEVar1;
  Entry *pEVar2;
  Value *this_00;
  byte bVar3;
  Entry *pEVar4;
  undefined8 uVar5;
  int *piVar6;
  
  if (this->nextFree == this->allocated) {
    addStorage(this);
  }
  this->offsets[to] = this->nextFree;
  pEVar1 = this->entries + this->nextFree;
  this->nextFree = (pEVar1->storage).data[0];
  bVar3 = fromSpan->offsets[fromIndex];
  fromSpan->offsets[fromIndex] = 0xff;
  pEVar4 = fromSpan->entries;
  pEVar2 = pEVar4 + bVar3;
  uVar5 = *(undefined8 *)((pEVar2->storage).data + 8);
  *(undefined8 *)(pEVar1->storage).data = *(undefined8 *)(pEVar2->storage).data;
  *(undefined8 *)((pEVar1->storage).data + 8) = uVar5;
  uVar5 = *(undefined8 *)((pEVar2->storage).data + 0x10);
  (pEVar2->storage).data[0x10] = '\0';
  (pEVar2->storage).data[0x11] = '\0';
  (pEVar2->storage).data[0x12] = '\0';
  (pEVar2->storage).data[0x13] = '\0';
  (pEVar2->storage).data[0x14] = '\0';
  (pEVar2->storage).data[0x15] = '\0';
  (pEVar2->storage).data[0x16] = '\0';
  (pEVar2->storage).data[0x17] = '\0';
  *(undefined8 *)((pEVar1->storage).data + 0x10) = uVar5;
  uVar5 = *(undefined8 *)((pEVar2->storage).data + 0x18);
  (pEVar2->storage).data[0x18] = '\0';
  (pEVar2->storage).data[0x19] = '\0';
  (pEVar2->storage).data[0x1a] = '\0';
  (pEVar2->storage).data[0x1b] = '\0';
  (pEVar2->storage).data[0x1c] = '\0';
  (pEVar2->storage).data[0x1d] = '\0';
  (pEVar2->storage).data[0x1e] = '\0';
  (pEVar2->storage).data[0x1f] = '\0';
  *(undefined8 *)((pEVar1->storage).data + 0x18) = uVar5;
  uVar5 = *(undefined8 *)((pEVar2->storage).data + 0x20);
  (pEVar2->storage).data[0x20] = '\0';
  (pEVar2->storage).data[0x21] = '\0';
  (pEVar2->storage).data[0x22] = '\0';
  (pEVar2->storage).data[0x23] = '\0';
  (pEVar2->storage).data[0x24] = '\0';
  (pEVar2->storage).data[0x25] = '\0';
  (pEVar2->storage).data[0x26] = '\0';
  (pEVar2->storage).data[0x27] = '\0';
  *(undefined8 *)((pEVar1->storage).data + 0x20) = uVar5;
  *(undefined8 *)((pEVar1->storage).data + 0x28) = *(undefined8 *)((pEVar2->storage).data + 0x28);
  *(undefined4 *)((pEVar1->storage).data + 0x30) = *(undefined4 *)((pEVar2->storage).data + 0x30);
  this_00 = (Value *)(pEVar4[bVar3].storage.data + 0x38);
  *(QList<QString> **)((pEVar1->storage).data + 0x38) = this_00->t;
  *(qsizetype *)((pEVar1->storage).data + 0x40) = this_00->cost;
  this_00->t = (QList<QString> *)0x0;
  *(Entry **)(*(long *)(pEVar1->storage).data + 8) = pEVar1;
  **(long **)((pEVar1->storage).data + 8) = (long)pEVar1;
  QCache<QtFontFallbacksCacheKey,_QList<QString>_>::Value::~Value(this_00);
  piVar6 = (int *)this_00[-3].cost;
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      QArrayData::deallocate(*(QArrayData **)((pEVar2->storage).data + 0x10),2,0x10);
    }
  }
  (pEVar2->storage).data[0] = fromSpan->nextFree;
  fromSpan->nextFree = bVar3;
  return;
}

Assistant:

void moveFromSpan(Span &fromSpan, size_t fromIndex, size_t to) noexcept(std::is_nothrow_move_constructible_v<Node>)
    {
        Q_ASSERT(to < SpanConstants::NEntries);
        Q_ASSERT(offsets[to] == SpanConstants::UnusedEntry);
        Q_ASSERT(fromIndex < SpanConstants::NEntries);
        Q_ASSERT(fromSpan.offsets[fromIndex] != SpanConstants::UnusedEntry);
        if (nextFree == allocated)
            addStorage();
        Q_ASSERT(nextFree < allocated);
        offsets[to] = nextFree;
        Entry &toEntry = entries[nextFree];
        nextFree = toEntry.nextFree();

        size_t fromOffset = fromSpan.offsets[fromIndex];
        fromSpan.offsets[fromIndex] = SpanConstants::UnusedEntry;
        Entry &fromEntry = fromSpan.entries[fromOffset];

        if constexpr (isRelocatable<Node>()) {
            memcpy(&toEntry, &fromEntry, sizeof(Entry));
        } else {
            new (&toEntry.node()) Node(std::move(fromEntry.node()));
            fromEntry.node().~Node();
        }
        fromEntry.nextFree() = fromSpan.nextFree;
        fromSpan.nextFree = static_cast<unsigned char>(fromOffset);
    }